

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::TextureUploadTests::init(TextureUploadTests *this,EVP_PKEY_CTX *ctx)

{
  UploadFunction uploadFunction;
  deUint32 format_00;
  deUint32 type_00;
  int texSize_00;
  Context *pCVar1;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  ulong extraout_RAX;
  ulong uVar2;
  TestCaseGroup *pTVar3;
  TestNode *node;
  char *pcVar4;
  TextureUploadAndDrawCase *this_02;
  uint local_d8;
  int i;
  int size;
  deUint32 type;
  deUint32 format;
  UploadFunction function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string caseName;
  int local_38;
  int texCombination;
  int texSize;
  int uploadFunc;
  TestCaseGroup *uploadAndDraw;
  TestCaseGroup *uploadCall;
  TextureUploadTests *this_local;
  
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"upload","Texture upload");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"upload_draw_swap",
             "Texture upload, draw & buffer swap");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  uVar2 = extraout_RAX;
  if (init()::textureSizes == '\0') {
    uVar2 = __cxa_guard_acquire(&init()::textureSizes);
    if ((int)uVar2 != 0) {
      init::textureSizes[0].size = 0x10;
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar3,(this->super_TestCaseGroup).m_context,"16x16","Texture size 16x16");
      init::textureSizes[0].uploadCallGroup = pTVar3;
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar3,(this->super_TestCaseGroup).m_context,"16x16","Texture size 16x16");
      init::textureSizes[1].size = 0x100;
      init::textureSizes[0].uploadAndDrawGroup = pTVar3;
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar3,(this->super_TestCaseGroup).m_context,"256x256","Texture size 256x256");
      init::textureSizes[1].uploadCallGroup = pTVar3;
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar3,(this->super_TestCaseGroup).m_context,"256x256","Texture size 256x256");
      init::textureSizes[2].size = 0x101;
      init::textureSizes[1].uploadAndDrawGroup = pTVar3;
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar3,(this->super_TestCaseGroup).m_context,"257x257","Texture size 257x257");
      init::textureSizes[2].uploadCallGroup = pTVar3;
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar3,(this->super_TestCaseGroup).m_context,"257x257","Texture size 257x257");
      init::textureSizes[3].size = 0x400;
      init::textureSizes[2].uploadAndDrawGroup = pTVar3;
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar3,(this->super_TestCaseGroup).m_context,"1024x1024","Texture size 1024x1024");
      init::textureSizes[3].uploadCallGroup = pTVar3;
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar3,(this->super_TestCaseGroup).m_context,"1024x1024","Texture size 1024x1024");
      init::textureSizes[4].size = 0x800;
      init::textureSizes[3].uploadAndDrawGroup = pTVar3;
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar3,(this->super_TestCaseGroup).m_context,"2048x2048","Texture size 2048x2048");
      init::textureSizes[4].uploadCallGroup = pTVar3;
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar3,(this->super_TestCaseGroup).m_context,"2048x2048","Texture size 2048x2048");
      init::textureSizes[4].uploadAndDrawGroup = pTVar3;
      uVar2 = __cxa_guard_release(&init()::textureSizes);
    }
  }
  texCombination = 0;
  while (texCombination < 2) {
    for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
      for (caseName.field_2._12_4_ = 0; (int)caseName.field_2._12_4_ < 8;
          caseName.field_2._12_4_ = caseName.field_2._12_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&function,"",(allocator<char> *)((long)&format + 3));
        std::operator+(&local_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &function,init::uploadFunctions[texCombination].nameLower);
        std::operator+(&local_80,&local_a0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,&local_80,init::textureCombinations[(int)caseName.field_2._12_4_].name);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&function);
        std::allocator<char>::~allocator((allocator<char> *)((long)&format + 3));
        uploadFunction = init::uploadFunctions[texCombination].func;
        format_00 = init::textureCombinations[(int)caseName.field_2._12_4_].format;
        type_00 = init::textureCombinations[(int)caseName.field_2._12_4_].type;
        texSize_00 = init::textureSizes[local_38].size;
        pTVar3 = init::textureSizes[local_38].uploadCallGroup;
        node = (TestNode *)operator_new(0x130);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        TextureUploadCallCase::TextureUploadCallCase
                  ((TextureUploadCallCase *)node,pCVar1,pcVar4,"",uploadFunction,format_00,type_00,
                   texSize_00);
        tcu::TestNode::addChild((TestNode *)pTVar3,node);
        pTVar3 = init::textureSizes[local_38].uploadAndDrawGroup;
        this_02 = (TextureUploadAndDrawCase *)operator_new(0x140);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        TextureUploadAndDrawCase::TextureUploadAndDrawCase
                  (this_02,pCVar1,pcVar4,"",uploadFunction,format_00,type_00,texSize_00);
        tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)this_02);
        std::__cxx11::string::~string((string *)local_60);
      }
    }
    texCombination = texCombination + 1;
    uVar2 = (ulong)(uint)texCombination;
  }
  local_d8 = 0;
  while ((int)local_d8 < 5) {
    tcu::TestNode::addChild
              ((TestNode *)this_00,(TestNode *)init::textureSizes[(int)local_d8].uploadCallGroup);
    tcu::TestNode::addChild
              ((TestNode *)this_01,(TestNode *)init::textureSizes[(int)local_d8].uploadAndDrawGroup)
    ;
    local_d8 = local_d8 + 1;
    uVar2 = (ulong)local_d8;
  }
  return (int)uVar2;
}

Assistant:

void TextureUploadTests::init (void)
{
	TestCaseGroup* uploadCall		= new TestCaseGroup(m_context, "upload",			"Texture upload");
	TestCaseGroup* uploadAndDraw	= new TestCaseGroup(m_context, "upload_draw_swap",	"Texture upload, draw & buffer swap");

	addChild(uploadCall);
	addChild(uploadAndDraw);

	static const struct
	{
		const char*		name;
		const char*		nameLower;
		UploadFunction	func;
	} uploadFunctions[] =
	{
		{ "texImage2D",		"teximage2d",		UPLOAD_TEXIMAGE2D },
		{ "texSubImage2D",	"texsubimage2d",	UPLOAD_TEXSUBIMAGE2D }
	};

	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	type;
	} textureCombinations[] =
	{
		{ "rgb_ubyte",				GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba_ubyte",				GL_RGBA,			GL_UNSIGNED_BYTE },
		{ "alpha_ubyte",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "luminance_ubyte",		GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "luminance-alpha_ubyte",	GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb_ushort565",			GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba_ushort4444",		GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba_ushort5551",		GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
	};

	static const struct
	{
		int				size;
		TestCaseGroup*	uploadCallGroup;
		TestCaseGroup*	uploadAndDrawGroup;
	} textureSizes[] =
	{
		{ 16,	new TestCaseGroup(m_context, "16x16",		"Texture size 16x16"),		new TestCaseGroup(m_context, "16x16",		"Texture size 16x16") },
		{ 256,	new TestCaseGroup(m_context, "256x256",		"Texture size 256x256"),	new TestCaseGroup(m_context, "256x256",		"Texture size 256x256") },
		{ 257,	new TestCaseGroup(m_context, "257x257",		"Texture size 257x257"),	new TestCaseGroup(m_context, "257x257",		"Texture size 257x257") },
		{ 1024,	new TestCaseGroup(m_context, "1024x1024",	"Texture size 1024x1024"),	new TestCaseGroup(m_context, "1024x1024",	"Texture size 1024x1024") },
		{ 2048,	new TestCaseGroup(m_context, "2048x2048",	"Texture size 2048x2048"),	new TestCaseGroup(m_context, "2048x2048",	"Texture size 2048x2048") },
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	FOR_EACH(uploadFunc,	 uploadFunctions,
	FOR_EACH(texSize,		 textureSizes,
	FOR_EACH(texCombination, textureCombinations,
	{
		string			caseName	= string("") + uploadFunctions[uploadFunc].nameLower + "_" + textureCombinations[texCombination].name;
		UploadFunction	function	= uploadFunctions[uploadFunc].func;
		deUint32		format		= textureCombinations[texCombination].format;
		deUint32		type		= textureCombinations[texCombination].type;
		int				size		= textureSizes[texSize].size;

		textureSizes[texSize].uploadCallGroup->addChild		(new TextureUploadCallCase		(m_context, caseName.c_str(), "", function, format, type, size));
		textureSizes[texSize].uploadAndDrawGroup->addChild	(new TextureUploadAndDrawCase	(m_context, caseName.c_str(), "", function, format, type, size));
	})));

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(textureSizes); i++)
	{
		uploadCall->addChild	(textureSizes[i].uploadCallGroup);
		uploadAndDraw->addChild	(textureSizes[i].uploadAndDrawGroup);
	}
}